

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xzlib.c
# Opt level: O1

int gz_next4(xz_statep state,unsigned_long *ret)

{
  uInt uVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  if ((state->zstrm).avail_in == 0) {
    (state->strm).avail_in = 0;
    (state->strm).next_in = (state->zstrm).next_in;
    iVar3 = xz_avail(state);
    (state->zstrm).avail_in = (uInt)(state->strm).avail_in;
    (state->zstrm).next_in = (state->strm).next_in;
    if (iVar3 != -1) goto LAB_001e870d;
LAB_001e8739:
    uVar7 = 0xffffffffffffffff;
  }
  else {
LAB_001e870d:
    uVar1 = (state->zstrm).avail_in;
    if (uVar1 == 0) goto LAB_001e8739;
    (state->zstrm).avail_in = uVar1 - 1;
    pbVar2 = (state->zstrm).next_in;
    (state->zstrm).next_in = pbVar2 + 1;
    uVar7 = (ulong)*pbVar2;
  }
  lVar5 = 0xffffff00;
  if ((state->zstrm).avail_in == 0) {
    (state->strm).avail_in = 0;
    (state->strm).next_in = (state->zstrm).next_in;
    iVar3 = xz_avail(state);
    (state->zstrm).avail_in = (uInt)(state->strm).avail_in;
    (state->zstrm).next_in = (state->strm).next_in;
    if (iVar3 != -1) goto LAB_001e878a;
  }
  else {
LAB_001e878a:
    uVar1 = (state->zstrm).avail_in;
    if (uVar1 != 0) {
      (state->zstrm).avail_in = uVar1 - 1;
      pbVar2 = (state->zstrm).next_in;
      (state->zstrm).next_in = pbVar2 + 1;
      lVar5 = (ulong)*pbVar2 << 8;
    }
  }
  if ((state->zstrm).avail_in == 0) {
    (state->strm).avail_in = 0;
    (state->strm).next_in = (state->zstrm).next_in;
    iVar3 = xz_avail(state);
    (state->zstrm).avail_in = (uInt)(state->strm).avail_in;
    (state->zstrm).next_in = (state->strm).next_in;
    if (iVar3 != -1) goto LAB_001e87fc;
LAB_001e882c:
    lVar6 = -0x10000;
  }
  else {
LAB_001e87fc:
    uVar1 = (state->zstrm).avail_in;
    if (uVar1 == 0) goto LAB_001e882c;
    (state->zstrm).avail_in = uVar1 - 1;
    pbVar2 = (state->zstrm).next_in;
    (state->zstrm).next_in = pbVar2 + 1;
    lVar6 = (ulong)*pbVar2 << 0x10;
  }
  if ((state->zstrm).avail_in == 0) {
    (state->strm).avail_in = 0;
    (state->strm).next_in = (state->zstrm).next_in;
    iVar3 = xz_avail(state);
    (state->zstrm).avail_in = (uInt)(state->strm).avail_in;
    (state->zstrm).next_in = (state->strm).next_in;
    if (iVar3 != -1) goto LAB_001e8877;
  }
  else {
LAB_001e8877:
    uVar1 = (state->zstrm).avail_in;
    if (uVar1 != 0) {
      (state->zstrm).avail_in = uVar1 - 1;
      pbVar2 = (state->zstrm).next_in;
      (state->zstrm).next_in = pbVar2 + 1;
      uVar4 = (uint)*pbVar2;
      goto LAB_001e88a7;
    }
  }
  uVar4 = 0xffffffff;
LAB_001e88a7:
  if (uVar4 == 0xffffffff) {
    iVar3 = -1;
  }
  else {
    *ret = (ulong)uVar4 * 0x1000000 + lVar5 + uVar7 + lVar6;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
gz_next4(xz_statep state, unsigned long *ret)
{
    int ch;
    unsigned long val;
    z_streamp strm = &(state->zstrm);

    val = NEXTZ();
    val += (unsigned) NEXTZ() << 8;
    val += (unsigned long) NEXTZ() << 16;
    ch = NEXTZ();
    if (ch == -1)
        return -1;
    val += (unsigned long) ch << 24;
    *ret = val;
    return 0;
}